

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O2

QLibraryScanResult __thiscall
QElfParser::parse(QElfParser *this,QByteArrayView data,QString *errMsg)

{
  int *piVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  bool bVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char16_t *str;
  byte bVar10;
  uchar *ident;
  char *s;
  int *piVar11;
  QArrayDataPointer<char16_t> *this_00;
  int *piVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  uint *puVar17;
  long in_FS_OFFSET;
  QLibraryScanResult QVar18;
  ErrorMaker local_a8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QByteArrayView local_68;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_a8.errMsg = (QString *)data.m_data;
  ident = (uchar *)data.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this < (QElfParser *)0x40) {
    QLibrary::tr((QString *)&local_58,"file too small",(char *)0x0,-1);
    anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
LAB_00438913:
    this_00 = &local_58;
  }
  else {
    bVar5 = anon_unknown.dwarf_16c41ea::ElfHeaderCommonCheck::checkElfMagic(ident);
    if (((*(short *)(ident + 0x12) != 0x3e || *(short *)(ident + 0x10) != 3) ||
         ((ident[6] != '\x01' || ident[5] != '\x01') || (ident[4] != '\x02' || !bVar5))) ||
       (*(int *)(ident + 0x14) != 1)) {
      if (bVar5) {
        if (ident[4] != '\x02') {
          s = "file is for a different word size";
          goto LAB_004388f5;
        }
        if (ident[5] != '\x01') {
          s = "file is for the wrong endianness";
          goto LAB_004388f5;
        }
        if ((ident[6] != '\x01') || (*(int *)(ident + 0x14) != 1)) {
          s = "file has an unknown ELF version";
          goto LAB_004388f5;
        }
        if (*(short *)(ident + 0x10) != 3) {
          s = "file is not a shared object";
          goto LAB_004388f5;
        }
        if (*(short *)(ident + 0x12) != 0x3e) {
          s = "file is for a different processor";
          goto LAB_004388f5;
        }
        local_58.d = (Data *)0x0;
        local_58.ptr = (char16_t *)0x0;
        local_58.size = 0;
      }
      else {
        s = "invalid signature";
LAB_004388f5:
        QLibrary::tr((QString *)&local_58,s,(char *)0x0,-1);
      }
      anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
      goto LAB_00438913;
    }
    if (*(short *)(ident + 0x36) == 0x38) {
      uVar14 = (ulong)*(ushort *)(ident + 0x38);
      if (uVar14 == 0xffff) {
        QLibrary::tr((QString *)&local_58,"unimplemented: PN_XNUM program headers",(char *)0x0,-1);
        anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
      }
      else {
        uVar7 = uVar14 * 0x38;
        uVar8 = *(ulong *)(ident + 0x20);
        if (this < (QElfParser *)(uVar7 + uVar8) || CARRY8(uVar7,uVar8)) {
          QLibrary::tr((QString *)&local_58,"program header table extends past the end of the file",
                       (char *)0x0,-1);
          anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
        }
        else {
          piVar12 = (int *)(ident + uVar8);
          piVar1 = piVar12 + uVar14 * 0xe;
          bVar10 = 0;
          piVar11 = piVar12;
          for (lVar13 = 0; uVar7 - lVar13 != 0; lVar13 = lVar13 + 0x38) {
            uVar14 = *(ulong *)(piVar11 + 2);
            uVar16 = *(ulong *)(piVar11 + 8);
            if ((CARRY8(uVar14,uVar16)) || (this < (QElfParser *)(uVar14 + uVar16))) {
              QLibrary::tr((QString *)&local_58,
                           "a program header entry extends past the end of the file",(char *)0x0,-1)
              ;
              anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
              goto LAB_00438913;
            }
            if (*piVar11 == 4) {
              uVar16 = *(ulong *)(ident + lVar13 + uVar8 + 0x30) - 1;
              if ((uVar16 < (*(ulong *)(ident + lVar13 + uVar8 + 0x30) ^ uVar16)) &&
                 ((uVar16 & uVar14) != 0)) {
                QLibrary::tr((QString *)&local_a0,
                             "a note segment start is not properly aligned (offset 0x%1, alignment %2)"
                             ,(char *)0x0,-1);
                QString::arg_impl((QString *)&local_88,(QString *)&local_a0,
                                  *(qulonglong *)(ident + lVar13 + 8 + uVar8),6,0x10,(QChar)0x30);
                QString::arg_impl((QString *)&local_58,(QString *)&local_88,
                                  *(qulonglong *)(ident + lVar13 + 0x30 + uVar8),0,10,(QChar)0x20);
                anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
                goto LAB_00438b0c;
              }
            }
            else if ((*piVar11 == 1) && (uVar16 != 0)) {
              bVar10 = bVar10 | ident[lVar13 + uVar8 + 4];
            }
            piVar11 = piVar11 + 0xe;
          }
          if ((bVar10 & 1) == 0) {
            QLibrary::tr((QString *)&local_58,"file has no code",(char *)0x0,-1);
            anon_unknown.dwarf_16c41ea::ErrorMaker::notplugin(&local_a8,(QString *)&local_58);
          }
          else {
            for (; piVar12 != piVar1; piVar12 = piVar12 + 0xe) {
              if (((*piVar12 == 4) && (*(long *)(piVar12 + 0xc) == 8)) &&
                 (-1 < *(long *)(piVar12 + 8))) {
                uVar8 = *(long *)(piVar12 + 8) + *(ulong *)(piVar12 + 2);
                uVar14 = *(ulong *)(piVar12 + 2);
                while (uVar7 = uVar14, 0x21 < (long)(uVar8 - uVar7)) {
                  uVar4 = *(uint *)(ident + uVar7);
                  if (CARRY8(uVar7 + 0x11,(ulong)uVar4)) break;
                  uVar16 = (ulong)*(uint *)(ident + uVar7 + 4);
                  uVar14 = uVar7 + 0x11 + (ulong)uVar4 & 0xfffffffffffffff8 | 5;
                  if ((CARRY8(uVar14,uVar16)) ||
                     (uVar14 = uVar14 + uVar16 & 0xfffffffffffffff8, uVar8 < uVar14)) break;
                  if (((uVar4 == 0xc) &&
                      ((5 < *(uint *)(ident + uVar7 + 4) &&
                       (*(int *)(ident + uVar7 + 8) == 0x74510001)))) &&
                     (iVar6 = bcmp(ident + uVar7 + 0xc,"qt-project!",0xc), iVar6 == 0)) {
                    lVar13 = uVar7 + 0x18;
                    goto LAB_00438923;
                  }
                }
              }
            }
            if (*(short *)(ident + 0x3a) != 0x40) {
              QLibrary::tr((QString *)&local_88,"unexpected section entry size (%1)",(char *)0x0,-1)
              ;
              QString::arg<unsigned_short,_true>
                        ((QString *)&local_58,(QString *)&local_88,*(unsigned_short *)(ident + 0x3a)
                         ,0,10,(QChar)0x20);
              anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
              goto LAB_0043871f;
            }
            uVar14 = *(ulong *)(ident + 0x28);
            if ((uVar14 == 0) || (uVar2 = *(ushort *)(ident + 0x3c), uVar2 == 0)) {
LAB_00438c20:
              anon_unknown.dwarf_16c41ea::ErrorMaker::notfound(&local_a8);
              goto LAB_0043891d;
            }
            uVar3 = *(ushort *)(ident + 0x3e);
            if (uVar2 <= uVar3) {
              QLibrary::tr((QString *)&local_a0,
                           "e_shstrndx greater than the number of sections e_shnum (%1 >= %2)",
                           (char *)0x0,-1);
              QString::arg<unsigned_short,_true>
                        ((QString *)&local_88,(QString *)&local_a0,*(unsigned_short *)(ident + 0x3e)
                         ,0,10,(QChar)0x20);
              QString::arg<unsigned_short,_true>
                        ((QString *)&local_58,(QString *)&local_88,*(unsigned_short *)(ident + 0x3c)
                         ,0,10,(QChar)0x20);
              anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
LAB_00438b0c:
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
              this_00 = &local_a0;
              goto LAB_00438918;
            }
            uVar8 = (ulong)uVar2 * 0x40;
            if (this < (QElfParser *)(uVar8 + uVar14) || CARRY8(uVar8,uVar14)) {
              QLibrary::tr((QString *)&local_58,"section table extends past the end of the file",
                           (char *)0x0,-1);
              anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
            }
            else {
              puVar17 = (uint *)(ident + uVar14);
              uVar7 = *(ulong *)(puVar17 + (ulong)uVar3 * 0x10 + 6);
              uVar16 = *(ulong *)(puVar17 + (ulong)uVar3 * 0x10 + 8);
              if ((QElfParser *)(uVar7 + uVar16) <= this && !CARRY8(uVar7,uVar16)) {
                for (uVar15 = 0; uVar8 != uVar15; uVar15 = uVar15 + 0x40) {
                  local_88.d = (Data *)0x0;
                  local_88.ptr = (char16_t *)0x0;
                  uVar9 = (ulong)*puVar17;
                  if (uVar16 < uVar9 || uVar16 - uVar9 == 0) {
                    QLibrary::tr((QString *)&local_58,
                                 "a section name extends past the end of the file",(char *)0x0,-1);
                    anon_unknown.dwarf_16c41ea::ErrorMaker::operator()
                              (&local_a8,(QString *)&local_58);
                    goto LAB_00438913;
                  }
                  str = (char16_t *)(ident + uVar9 + uVar7);
                  local_88.d = (Data *)qstrnlen((char *)str,uVar16 - uVar9);
                  local_88.ptr = str;
                  if (puVar17[1] != 8) {
                    if ((CARRY8(*(ulong *)(ident + uVar15 + uVar14 + 0x18),
                                *(ulong *)(ident + uVar15 + uVar14 + 0x20))) ||
                       (this < (QElfParser *)
                               (*(ulong *)(ident + uVar15 + uVar14 + 0x18) +
                               *(ulong *)(ident + uVar15 + uVar14 + 0x20)))) {
                      QLibrary::tr((QString *)&local_58,
                                   "section contents extend past the end of the file",(char *)0x0,-1
                                  );
                      anon_unknown.dwarf_16c41ea::ErrorMaker::operator()
                                (&local_a8,(QString *)&local_58);
                      goto LAB_00438913;
                    }
                    local_58.d = (Data *)0xb;
                    local_58.ptr = L".qtmetadata";
                    bVar5 = ::operator!=((QLatin1StringView *)&local_88,
                                         (QLatin1StringView *)&local_58);
                    if (!bVar5) {
                      if (*(ulong *)(ident + uVar15 + 0x20 + uVar14) < 0x10) {
                        QLibrary::tr((QString *)&local_58,".qtmetadata section is too small",
                                     (char *)0x0,-1);
                        anon_unknown.dwarf_16c41ea::ErrorMaker::operator()
                                  (&local_a8,(QString *)&local_58);
                        goto LAB_00438913;
                      }
                      local_a0.d = (Data *)0xc;
                      local_a0.ptr = L"QTMETADATA !";
                      local_68.m_data =
                           (storage_type *)(ident + *(long *)(ident + uVar15 + uVar14 + 0x18));
                      local_68.m_size = 0xc;
                      bVar5 = ::operator!=((QByteArrayView *)&local_a0,&local_68);
                      if (bVar5) {
                        QLibrary::tr((QString *)&local_58,".qtmetadata section has incorrect magic",
                                     (char *)0x0,-1);
                        anon_unknown.dwarf_16c41ea::ErrorMaker::operator()
                                  (&local_a8,(QString *)&local_58);
                        goto LAB_00438913;
                      }
                      if ((*(ulong *)(ident + uVar15 + 8 + uVar14) & 1) != 0) {
                        QLibrary::tr((QString *)&local_58,".qtmetadata section is writable",
                                     (char *)0x0,-1);
                        anon_unknown.dwarf_16c41ea::ErrorMaker::operator()
                                  (&local_a8,(QString *)&local_58);
                        goto LAB_00438913;
                      }
                      if ((*(ulong *)(ident + uVar15 + 8 + uVar14) & 4) != 0) {
                        QLibrary::tr((QString *)&local_58,".qtmetadata section is executable",
                                     (char *)0x0,-1);
                        anon_unknown.dwarf_16c41ea::ErrorMaker::operator()
                                  (&local_a8,(QString *)&local_58);
                        goto LAB_00438913;
                      }
                      lVar13 = *(long *)(ident + uVar15 + uVar14 + 0x18) + 0xc;
                      uVar16 = *(long *)(ident + uVar15 + uVar14 + 0x20) - 0xc;
                      goto LAB_00438923;
                    }
                  }
                  puVar17 = puVar17 + 0x10;
                }
                goto LAB_00438c20;
              }
              QLibrary::tr((QString *)&local_58,
                           "section header string table extends past the end of the file",
                           (char *)0x0,-1);
              anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
            }
          }
        }
      }
      goto LAB_00438913;
    }
    QLibrary::tr((QString *)&local_88,"unexpected program header entry size (%1)",(char *)0x0,-1);
    QString::arg<unsigned_short,_true>
              ((QString *)&local_58,(QString *)&local_88,*(unsigned_short *)(ident + 0x36),0,10,
               (QChar)0x20);
    anon_unknown.dwarf_16c41ea::ErrorMaker::operator()(&local_a8,(QString *)&local_58);
LAB_0043871f:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    this_00 = &local_88;
  }
LAB_00438918:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(this_00);
LAB_0043891d:
  lVar13 = 0;
  uVar16 = 0;
LAB_00438923:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  QVar18.length = uVar16;
  QVar18.pos = lVar13;
  return QVar18;
}

Assistant:

QLibraryScanResult QElfParser::parse(QByteArrayView data, QString *errMsg)
{
    ErrorMaker error(errMsg);
    if (size_t(data.size()) < sizeof(T::Ehdr)) {
        qEDebug << "file too small:" << size_t(data.size());
        return error(QLibrary::tr("file too small"));
    }

    qEDebug << ElfHeaderDebug{ reinterpret_cast<const uchar *>(data.data()) };

    auto header = reinterpret_cast<const T::Ehdr *>(data.data());
    if (!ElfHeaderCheck<>::checkHeader(*header))
        return error(ElfHeaderCheck<>::explainCheckFailure(*header));

    qEDebug << "contains" << header->e_phnum << "program headers of"
            << header->e_phentsize << "bytes at offset" << header->e_phoff;
    qEDebug << "contains" << header->e_shnum << "sections of" << header->e_shentsize
            << "bytes at offset" << header->e_shoff
            << "; section header string table (shstrtab) is entry" << header->e_shstrndx;

    // some sanity checks
    if constexpr (IncludeValidityChecks) {
        if (header->e_phentsize != sizeof(T::Phdr))
            return error(QLibrary::tr("unexpected program header entry size (%1)")
                         .arg(header->e_phentsize));
    }

    if (!preScanProgramHeaders(data, error))
        return {};

    if (QLibraryScanResult r = scanProgramHeadersForNotes(data, error); r.length)
        return r;

    if (!ElfNotesAreMandatory) {
        if constexpr (IncludeValidityChecks) {
            if (header->e_shentsize != sizeof(T::Shdr))
                return error(QLibrary::tr("unexpected section entry size (%1)")
                             .arg(header->e_shentsize));
        }
        if (header->e_shoff == 0 || header->e_shnum == 0) {
            // this is still a valid ELF file but we don't have a section table
            qEDebug << "no section table present, not able to find Qt metadata";
            return error.notfound();
        }

        if (header->e_shnum && header->e_shstrndx >= header->e_shnum)
            return error(QLibrary::tr("e_shstrndx greater than the number of sections e_shnum (%1 >= %2)")
                         .arg(header->e_shstrndx).arg(header->e_shnum));
        return scanSections(data, error);
    }
    return error.notfound();
}